

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

string * __thiscall
cmCTestCoverageHandler::FindFile
          (string *__return_storage_ptr__,cmCTestCoverageHandler *this,
          cmCTestCoverageHandlerContainer *cont,string *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string fileNameNoE;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_50,fileName);
  pcVar2 = (cont->SourceDir)._M_dataplus._M_p;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + (cont->SourceDir)._M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)local_50._M_dataplus._M_p);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  paVar1 = &local_d0.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  bVar3 = cmsys::SystemTools::FileExists(&local_d0);
  if (bVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_d0.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d0._M_dataplus._M_p;
LAB_0017a64c:
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_d0.field_2._M_allocated_capacity;
    }
  }
  else {
    pcVar2 = (cont->BinaryDir)._M_dataplus._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + (cont->BinaryDir)._M_string_length);
    std::__cxx11::string::append((char *)local_70);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)local_50._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_a0 = *plVar5;
      lStack_98 = plVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*plVar4;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    bVar3 = cmsys::SystemTools::FileExists(&local_d0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (!bVar3) {
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0017a685;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d0._M_dataplus._M_p;
      goto LAB_0017a64c;
    }
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_d0.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d0.field_2._8_8_;
  }
  __return_storage_ptr__->_M_string_length = local_d0._M_string_length;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_allocated_capacity =
       local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
LAB_0017a685:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCoverageHandler::FindFile(
  cmCTestCoverageHandlerContainer* cont, std::string const& fileName)
{
  std::string fileNameNoE =
    cmSystemTools::GetFilenameWithoutLastExtension(fileName);
  // First check in source and binary directory
  std::string fullName = cont->SourceDir + "/" + fileNameNoE + ".py";
  if (cmSystemTools::FileExists(fullName)) {
    return fullName;
  }
  fullName = cont->BinaryDir + "/" + fileNameNoE + ".py";
  if (cmSystemTools::FileExists(fullName)) {
    return fullName;
  }
  return "";
}